

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

ImWchar * ImStb::stb_text_createundo(StbUndoState *state,int pos,int insert_len,int delete_len)

{
  StbUndoRecord *pSVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  StbUndoRecord *r;
  StbUndoState *in_stack_ffffffffffffffd8;
  ImWchar *local_8;
  
  pSVar1 = stb_text_create_undo_record(in_stack_ffffffffffffffd8,0);
  if (pSVar1 == (StbUndoRecord *)0x0) {
    local_8 = (ImWchar *)0x0;
  }
  else {
    pSVar1->where = in_ESI;
    pSVar1->insert_length = in_EDX;
    pSVar1->delete_length = in_ECX;
    if (in_EDX == 0) {
      pSVar1->char_storage = -1;
      local_8 = (ImWchar *)0x0;
    }
    else {
      pSVar1->char_storage = *(int *)(in_RDI + 0xe04);
      *(int *)(in_RDI + 0xe04) = in_EDX + *(int *)(in_RDI + 0xe04);
      local_8 = (ImWchar *)(in_RDI + 0x630 + (long)pSVar1->char_storage * 2);
    }
  }
  return local_8;
}

Assistant:

static STB_TEXTEDIT_CHARTYPE *stb_text_createundo(StbUndoState *state, int pos, int insert_len, int delete_len)
{
   StbUndoRecord *r = stb_text_create_undo_record(state, insert_len);
   if (r == NULL)
      return NULL;

   r->where = pos;
   r->insert_length = (STB_TEXTEDIT_POSITIONTYPE) insert_len;
   r->delete_length = (STB_TEXTEDIT_POSITIONTYPE) delete_len;

   if (insert_len == 0) {
      r->char_storage = -1;
      return NULL;
   } else {
      r->char_storage = state->undo_char_point;
      state->undo_char_point += insert_len;
      return &state->undo_char[r->char_storage];
   }
}